

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void parse(char *fileName,ValidationErrorHandler *errorHandler)

{
  String *in_RDI;
  Root root;
  Writer writer;
  Loader loader;
  Writer *in_stack_fffffffffffffb10;
  Root *this;
  undefined1 local_4d9 [25];
  Loader *in_stack_fffffffffffffb40;
  _func_int **in_stack_fffffffffffffb48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb50;
  IWriter local_490;
  ILoader local_488 [18];
  IErrorHandler *in_stack_fffffffffffffc08;
  Loader *in_stack_fffffffffffffc10;
  
  COLLADASaxFWL::Loader::Loader(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  Writer::Writer(in_stack_fffffffffffffb10);
  COLLADAFW::Root::Root((Root *)&stack0xfffffffffffffb48,local_488,&local_490);
  this = (Root *)local_4d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48,
             (allocator<char> *)in_stack_fffffffffffffb40);
  COLLADAFW::Root::loadDocument(this,in_RDI);
  std::__cxx11::string::~string((string *)(local_4d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_4d9);
  version = COLLADASaxFWL::Loader::getCOLLADAVersion((Loader *)local_488);
  COLLADAFW::Root::~Root((Root *)&stack0xfffffffffffffb48);
  Writer::~Writer((Writer *)0x773130);
  COLLADASaxFWL::Loader::~Loader(in_stack_fffffffffffffb40);
  return;
}

Assistant:

void parse(char* fileName, ValidationErrorHandler& errorHandler)
{
	COLLADASaxFWL::Loader loader(&errorHandler);

	::Writer writer;

	COLLADAFW::Root root(&loader, &writer);

	root.loadDocument(fileName);
	version = loader.getCOLLADAVersion();
}